

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O1

void test_server_invalid_utf8(void)

{
  nng_err nVar1;
  int iVar2;
  nng_http_status nVar3;
  size_t size;
  char *pcVar4;
  undefined1 local_850 [8];
  server_test st;
  nng_http_handler *h;
  
  pcVar4 = doc1;
  size = strlen(doc1);
  nVar1 = nng_http_handler_alloc_static
                    ((nng_http_handler **)(st.urlstr + 0x7f8),"/home.html",pcVar4,size,"text/html");
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x231,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc_static( &h, \"/home.html\", doc1, strlen(doc1), \"text/html\")"
                         ,pcVar4,nVar1);
  if (iVar2 != 0) {
    server_setup((server_test *)local_850,(nng_http_handler *)st.urlstr._2040_8_);
    nVar1 = nng_http_set_uri((nng_http *)st.cli,anon_var_dwarf_1876,(char *)0x0);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x235,"%s: expected success, got %s (%d)",
                           "nng_http_set_uri(st.conn, \"/home\\xFF.html\", NULL)",pcVar4,nVar1);
    if (iVar2 != 0) {
      nng_http_write_request((nng_http *)st.cli,(nng_aio *)st.url);
      nng_aio_wait((nng_aio *)st.url);
      nng_http_read_response((nng_http *)st.cli,(nng_aio *)st.url);
      nng_aio_wait((nng_aio *)st.url);
      nVar1 = nng_aio_result((nng_aio *)st.url);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                             ,0x23c,"%s: expected success, got %s (%d)","nng_aio_result(st.aio)",
                             pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar3 = nng_http_get_status((nng_http *)st.cli);
        acutest_check_((uint)(nVar3 == NNG_HTTP_STATUS_BAD_REQUEST),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                       ,0x23e,"%s","nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_BAD_REQUEST)");
        nVar3 = nng_http_get_status((nng_http *)st.cli);
        pcVar4 = nng_http_get_reason((nng_http *)st.cli);
        acutest_message_("HTTP status: expected %d (%s) got %d (%s)",400,
                         "NNG_HTTP_STATUS_BAD_REQUEST",(ulong)nVar3,pcVar4);
        server_free((server_test *)local_850);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_server_invalid_utf8(void)
{
	struct server_test st;
	nng_http_handler  *h;

	NUTS_PASS(nng_http_handler_alloc_static(
	    &h, "/home.html", doc1, strlen(doc1), "text/html"));

	server_setup(&st, h);

	NUTS_PASS(nng_http_set_uri(st.conn, "/home\xFF.html", NULL));
	nng_http_write_request(st.conn, st.aio);

	nng_aio_wait(st.aio);

	nng_http_read_response(st.conn, st.aio);
	nng_aio_wait(st.aio);
	NUTS_PASS(nng_aio_result(st.aio));

	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_BAD_REQUEST);

	server_free(&st);
}